

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void output_base(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %ssindex[] = {%39d,",symbol_prefix,(ulong)(uint)*base);
  if (1 < nstates) {
    iVar1 = 10;
    lVar3 = 1;
    do {
      if (iVar1 < 10) {
        iVar1 = iVar1 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar1 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < nstates);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %srindex[] = {%39d,",symbol_prefix,(ulong)(uint)base[nstates]);
  if (SBORROW4(nstates + 1,nstates * 2) != nstates + 1 + nstates * -2 < 0) {
    lVar3 = (long)nstates + 1;
    iVar1 = 10;
    do {
      if (iVar1 < 10) {
        iVar1 = iVar1 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar1 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar3]);
      lVar3 = lVar3 + 1;
    } while (SBORROW8(lVar3,(long)nstates * 2) != lVar3 + (long)nstates * -2 < 0);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %scindex[] = {%39d,",symbol_prefix,
          (ulong)(uint)base[(long)nstates * 2]);
  iVar1 = (int)((long)nstates * 2) + 1;
  if (SBORROW4(iVar1,nstates * 3) != iVar1 + nstates * -3 < 0) {
    uVar2 = (long)nstates * 2 | 1;
    iVar1 = 10;
    do {
      if (iVar1 < 10) {
        iVar1 = iVar1 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar1 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)nstates * 3);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %sgindex[] = {%39d,",symbol_prefix,
          (ulong)(uint)base[(long)nstates * 3]);
  if ((int)((long)nstates * 3) + 1 < nvectors + -1) {
    lVar3 = (long)nstates * 3 + 1;
    iVar1 = 10;
    do {
      if (iVar1 < 10) {
        iVar1 = iVar1 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar1 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)base[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (long)nvectors + -1);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  free(base);
  return;
}

Assistant:

void output_base()
{
    register int i, j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %ssindex[] = {%39d,", symbol_prefix, base[0]);
    j = 10;
    for (i = 1; i < nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %srindex[] = {%39d,", symbol_prefix, base[nstates]);
    j = 10;
    for (i = nstates + 1; i < 2*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %scindex[] = {%39d,", symbol_prefix, base[2*nstates]);
    j = 10;
    for (i = 2*nstates + 1; i < 3*nstates; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }


    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %sgindex[] = {%39d,", symbol_prefix,
	    base[3*nstates]);
    j = 10;
    for (i = 3*nstates + 1; i < nvectors - 1; i++) {
	if (j >= 10) {
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1; }
	else
	    ++j;
	fprintf(output_file, "%5d,", base[i]); }

    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
    FREE(base);
}